

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

void my_numbox_size(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  t_float tVar5;
  
  tVar5 = atom_getfloatarg(0,ac,av);
  iVar4 = 1;
  if (1 < (int)tVar5) {
    iVar4 = (int)tVar5;
  }
  x->x_numwidth = iVar4;
  if (1 < ac) {
    tVar5 = atom_getfloatarg(1,ac,av);
    iVar4 = 8;
    if (8 < (int)tVar5) {
      iVar4 = (int)tVar5;
    }
    (x->x_gui).x_h = iVar4 * ((x->x_gui).x_glist)->gl_zoom;
  }
  uVar2 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar4 = 0x1f;
  if (uVar2 == 2) {
    iVar4 = 0x19;
  }
  iVar3 = 0x1b;
  if (uVar2 != 1) {
    iVar3 = iVar4;
  }
  iVar4 = (x->x_gui).x_h;
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w =
       ((int)(CONCAT44(iVar4 - (iVar4 >> 0x1f) >> 0x1f,iVar4 / 2) / (long)iVar1) +
        (x->x_numwidth * (x->x_gui).x_fontsize * iVar3) / 0x24 + 4) * iVar1;
  iemgui_size(x,&x->x_gui);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  return;
}

Assistant:

static void my_numbox_size(t_my_numbox *x, t_symbol *s, int ac, t_atom *av)
{
    int h, w;

    w = (int)atom_getfloatarg(0, ac, av);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(ac > 1)
    {
        h = (int)atom_getfloatarg(1, ac, av);
        if(h < IEM_GUI_MINSIZE)
            h = IEM_GUI_MINSIZE;
        x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    }
    my_numbox_calc_fontwidth(x);
    iemgui_size((void *)x, &x->x_gui);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}